

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLevelQ.c
# Opt level: O1

void * cuddLevelQueueEnqueue(DdLevelQueue *queue,void *key,int level)

{
  int iVar1;
  DdQueueItem **ppDVar2;
  DdQueueItem *pDVar3;
  DdQueueItem *pDVar4;
  _func_void_long *p_Var5;
  ulong uVar6;
  uint uVar7;
  DdQueueItem *__s;
  DdQueueItem **__s_00;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  DdLevelQueue *pDVar12;
  size_t __size;
  
  uVar8 = (ulong)(uint)level;
  for (__s = queue->buckets[(int)((uint)((int)key * 0xc00005) >> ((byte)queue->shift & 0x1f))];
      __s != (DdQueueItem *)0x0; __s = __s->cnext) {
    if (__s->key == key) goto LAB_007d5f12;
  }
  __s = (DdQueueItem *)0x0;
LAB_007d5f12:
  if (__s == (DdQueueItem *)0x0) {
    __s = queue->freelist;
    if (__s == (DdQueueItem *)0x0) {
      __s = (DdQueueItem *)malloc((long)queue->itemsize);
      if (__s == (DdQueueItem *)0x0) {
        return (void *)0x0;
      }
    }
    else {
      queue->freelist = __s->next;
    }
    memset(__s,0,(long)queue->itemsize);
    __s->key = key;
    iVar10 = queue->size;
    queue->size = iVar10 + 1;
    ppDVar2 = queue->last;
    uVar9 = (ulong)level;
    if (ppDVar2[uVar9] == (DdQueueItem *)0x0) {
      uVar6 = uVar9;
      if (level != 0) {
        do {
          uVar8 = uVar6;
          if (ppDVar2[uVar8] != (DdQueueItem *)0x0) goto LAB_007d5f8c;
          uVar6 = uVar8 - 1;
        } while (uVar8 - 1 != 0);
        uVar8 = 0;
      }
LAB_007d5f8c:
      if (ppDVar2[(int)uVar8] == (DdQueueItem *)0x0) {
        __s->next = (DdQueueItem *)queue->first;
        pDVar12 = queue;
      }
      else {
        __s->next = ppDVar2[(int)uVar8]->next;
        pDVar12 = (DdLevelQueue *)ppDVar2[(int)uVar8];
      }
    }
    else {
      __s->next = ppDVar2[uVar9]->next;
      pDVar12 = (DdLevelQueue *)ppDVar2[uVar9];
    }
    pDVar12->first = __s;
    ppDVar2[uVar9] = __s;
    p_Var5 = Extra_UtilMMoutOfMemory;
    iVar1 = queue->maxsize;
    if (iVar1 <= iVar10) {
      ppDVar2 = queue->buckets;
      uVar7 = queue->numBuckets;
      Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
      __size = (long)(int)(uVar7 * 2) << 3;
      __s_00 = (DdQueueItem **)malloc(__size);
      queue->buckets = __s_00;
      Extra_UtilMMoutOfMemory = p_Var5;
      if (__s_00 == (DdQueueItem **)0x0) {
        queue->maxsize = iVar1 * 2;
      }
      else {
        queue->numBuckets = uVar7 * 2;
        iVar10 = queue->shift + -1;
        queue->shift = iVar10;
        queue->maxsize = iVar1 * 2;
        memset(__s_00,0,__size);
        if (0 < (int)uVar7) {
          uVar8 = 0;
          do {
            pDVar4 = ppDVar2[uVar8];
            while (pDVar4 != (DdQueueItem *)0x0) {
              uVar11 = (uint)(*(int *)&pDVar4->key * 0xc00005) >> ((byte)iVar10 & 0x1f);
              pDVar3 = pDVar4->cnext;
              pDVar4->cnext = __s_00[(int)uVar11];
              __s_00[(int)uVar11] = pDVar4;
              pDVar4 = pDVar3;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar7);
        }
        if (ppDVar2 != (DdQueueItem **)0x0) {
          free(ppDVar2);
        }
      }
    }
    uVar7 = (uint)(*(int *)&__s->key * 0xc00005) >> ((byte)queue->shift & 0x1f);
    ppDVar2 = queue->buckets;
    __s->cnext = ppDVar2[(int)uVar7];
    ppDVar2[(int)uVar7] = __s;
  }
  return __s;
}

Assistant:

void *
cuddLevelQueueEnqueue(
  DdLevelQueue * queue /* level queue */,
  void * key /* key to be enqueued */,
  int  level /* level at which to insert */)
{
    int plevel;
    DdQueueItem *item;

#ifdef DD_DEBUG
    assert(level < queue->levels);
#endif
    /* Check whether entry for this node exists. */
    item = hashLookup(queue,key);
    if (item != NULL) return(item);

    /* Get a free item from either the free list or the memory manager. */
    if (queue->freelist == NULL) {
        item = (DdQueueItem *) ABC_ALLOC(char, queue->itemsize);
        if (item == NULL)
            return(NULL);
    } else {
        item = queue->freelist;
        queue->freelist = item->next;
    }
    /* Initialize. */
    memset(item, 0, queue->itemsize);
    item->key = key;
    /* Update stats. */
    queue->size++;

    if (queue->last[level]) {
        /* There are already items for this level in the queue. */
        item->next = queue->last[level]->next;
        queue->last[level]->next = item;
    } else {
        /* There are no items at the current level.  Look for the first
        ** non-empty level preceeding this one. */
        plevel = level;
        while (plevel != 0 && queue->last[plevel] == NULL)
            plevel--;
        if (queue->last[plevel] == NULL) {
            /* No element precedes this one in the queue. */
            item->next = (DdQueueItem *) queue->first;
            queue->first = item;
        } else {
            item->next = queue->last[plevel]->next;
            queue->last[plevel]->next = item;
        }
    }
    queue->last[level] = item;

    /* Insert entry for the key in the hash table. */
    if (hashInsert(queue,item) == 0) {
        return(NULL);
    }
    return(item);

}